

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatinbuilder.cpp
# Opt level: O0

void __thiscall
icu_63::CollationFastLatinBuilder::CollationFastLatinBuilder
          (CollationFastLatinBuilder *this,UErrorCode *errorCode)

{
  UErrorCode *errorCode_local;
  CollationFastLatinBuilder *this_local;
  
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__CollationFastLatinBuilder_0049d7f8;
  this->ce0 = 0;
  this->ce1 = 0;
  UVector64::UVector64(&this->contractionCEs,errorCode);
  UVector64::UVector64(&this->uniqueCEs,errorCode);
  this->miniCEs = (uint16_t *)0x0;
  this->firstDigitPrimary = 0;
  this->firstLatinPrimary = 0;
  this->lastLatinPrimary = 0;
  this->firstShortPrimary = 0;
  this->shortPrimaryOverflow = '\0';
  UnicodeString::UnicodeString(&this->result);
  this->headerLength = 0;
  return;
}

Assistant:

CollationFastLatinBuilder::CollationFastLatinBuilder(UErrorCode &errorCode)
        : ce0(0), ce1(0),
          contractionCEs(errorCode), uniqueCEs(errorCode),
          miniCEs(NULL),
          firstDigitPrimary(0), firstLatinPrimary(0), lastLatinPrimary(0),
          firstShortPrimary(0), shortPrimaryOverflow(FALSE),
          headerLength(0) {
}